

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O0

value method_metadata_async(method_conflict m)

{
  value *str;
  value pvVar1;
  value *async_array;
  value async;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  value local_8;
  
  local_8 = value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    str = value_to_array((value)0x1252ac);
    pvVar1 = value_create_string((char *)str,in_stack_ffffffffffffffd8);
    *str = pvVar1;
    if (*str == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (value)0x0;
    }
    else {
      pvVar1 = value_create_bool('\0');
      str[1] = pvVar1;
      if (str[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value method_metadata_async(method m)
{
	static const char async_str[] = "async";

	value async = value_create_array(NULL, 2);

	value *async_array;

	if (async == NULL)
	{
		return NULL;
	}

	async_array = value_to_array(async);

	async_array[0] = value_create_string(async_str, sizeof(async_str) - 1);

	if (async_array[0] == NULL)
	{
		value_type_destroy(async);

		return NULL;
	}

	async_array[1] = value_create_bool(m->async == SYNCHRONOUS ? 0L : 1L);

	if (async_array[1] == NULL)
	{
		value_type_destroy(async);

		return NULL;
	}

	return async;
}